

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_scatter_acc2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv,void *alpha)

{
  long lVar1;
  long proc;
  Integer *owner;
  logical lVar2;
  long lVar3;
  long lVar4;
  long nv_00;
  Integer *base;
  double dVar5;
  Integer subscrpt [2];
  char err_string [256];
  Integer local_170;
  void *local_168;
  long local_160;
  Integer *local_158;
  void *local_150;
  Integer local_148;
  Integer local_140;
  char local_138 [264];
  
  if (0 < nv) {
    local_160 = (long)GA[g_a + 1000].type;
    local_170 = nv;
    local_168 = v;
    local_150 = alpha;
    if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
      sprintf(local_138,"%s: INVALID ARRAY HANDLE","ga_scatter_acc");
      pnga_error(local_138,g_a);
    }
    if (GA[g_a + 1000].actv == 0) {
      sprintf(local_138,"%s: ARRAY NOT ACTIVE","ga_scatter_acc");
      pnga_error(local_138,g_a);
    }
    GAstat.numsca = GAstat.numsca + 1;
    owner = (Integer *)pnga_malloc(nv,0x3f2,"ga_scatter_acc--p");
    base = owner;
    local_158 = owner;
    for (lVar3 = 0; lVar3 < nv; lVar3 = lVar3 + 1) {
      local_148 = i[lVar3];
      local_140 = j[lVar3];
      lVar2 = pnga_locate(g_a,&local_148,owner);
      if (lVar2 == 0) {
        sprintf(local_138,"invalid i/j=(%ld,%ld)",i[lVar3],j[lVar3]);
        base = local_158;
        pnga_error(local_138,g_a);
      }
      owner = owner + 1;
    }
    lVar3 = *(long *)(&uleb128_001cd4a8 + local_160 * 0x10);
    dVar5 = (double)lVar3;
    GAbytes.scatot = (double)nv * dVar5 + GAbytes.scatot;
    ga_sort_scat(&local_170,local_168,i,j,base,local_160);
    lVar4 = 0;
    do {
      proc = base[lVar4];
      for (nv_00 = 0; (lVar1 = lVar4 + nv_00, lVar1 < local_170 && (proc == base[lVar4 + nv_00]));
          nv_00 = nv_00 + 1) {
      }
      if (proc == GAme) {
        GAbytes.scaloc = (double)nv_00 * dVar5 + GAbytes.scaloc;
      }
      gai_scatter_acc_local
                (g_a,(void *)(lVar4 * lVar3 + (long)local_168),i + lVar4,j + lVar4,nv_00,local_150,
                 proc);
      lVar4 = lVar1;
    } while (lVar1 < local_170);
    pnga_free(base);
  }
  return;
}

Assistant:

void pnga_scatter_acc2d(g_a, v, i, j, nv, alpha)
     Integer g_a, nv, *i, *j;
     void *v, *alpha;
{
register Integer k;
Integer item_size;
Integer first, nelem, proc, type=GA[GA_OFFSET + g_a].type;
Integer *int_ptr;
Integer subscrpt[2];

  if (nv < 1) return;

  ga_check_handleM(g_a, "ga_scatter_acc");
  
  GAstat.numsca++;

  int_ptr = (Integer*) pnga_malloc(nv, MT_F_INT, "ga_scatter_acc--p");

  /* find proc that owns the (i,j) element; store it in temp: int_ptr */
  for(k=0; k< nv; k++) {
    subscrpt[0] = *(i+k);
    subscrpt[1] = *(j+k);
    if(! pnga_locate(g_a, subscrpt, int_ptr+k)){
         char err_string[ERR_STR_LEN];
         sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
         pnga_error(err_string,g_a);
    }
  }

  /* determine limit for message size --  v,i, & j will travel together */
  item_size = GAsizeofM(type);
  GAbytes.scatot += (double)item_size*nv ;

  /* Sort the entries by processor */
  ga_sort_scat(&nv, v, i, j, int_ptr, type );

  /* go through the list again executing scatter for each processor */

  first = 0;
  do {
      proc = int_ptr[first];
      nelem = 0;

      /* count entries for proc from "first" to last */
      for(k=first; k< nv; k++){
        if(proc == int_ptr[k]) nelem++;
        else break;
      }

      if(proc == GAme){
             GAbytes.scaloc += (double)item_size* nelem ;
      }

      gai_scatter_acc_local(g_a, ((char*)v)+item_size*first, i+first,
                           j+first, nelem, alpha, proc);
      first += nelem;

  }while (first< nv);

  pnga_free(int_ptr);

}